

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O3

void __thiscall
CivetServer::addWebSocketHandler(CivetServer *this,string *uri,CivetWebSocketHandler *handler)

{
  mg_set_websocket_handler
            (this->context,(uri->_M_dataplus)._M_p,webSocketConnectionHandler,webSocketReadyHandler,
             webSocketDataHandler,webSocketCloseHandler,handler);
  return;
}

Assistant:

void
CivetServer::addWebSocketHandler(const std::string &uri,
                                 CivetWebSocketHandler *handler)
{
	mg_set_websocket_handler(context,
	                         uri.c_str(),
	                         webSocketConnectionHandler,
	                         webSocketReadyHandler,
	                         webSocketDataHandler,
	                         webSocketCloseHandler,
	                         handler);
}